

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

size_t ssh2_try_send(ssh2_channel *c)

{
  bufchain *ch;
  uint *puVar1;
  ssh2_connection_state *psVar2;
  _func_PktOut_ptr_int *p_Var3;
  size_t sVar4;
  PktOut *pPVar5;
  size_t sVar6;
  unsigned_long val;
  BinarySink *bs;
  bufchain *ch_00;
  ulong len;
  ptrlen pl;
  ptrlen pVar7;
  
  psVar2 = c->connlayer;
  if ((c->halfopen == false) && (c->remwindow != 0)) {
    ch = &c->errbuffer;
    do {
      sVar4 = bufchain_size(&c->outbuffer);
      if (sVar4 == 0) {
        sVar4 = bufchain_size(ch);
        if (sVar4 == 0) break;
      }
      sVar4 = bufchain_size(ch);
      ch_00 = ch;
      if (sVar4 == 0) {
        ch_00 = &c->outbuffer;
      }
      pVar7 = bufchain_prefix(ch_00);
      len = (ulong)c->remwindow;
      if (pVar7.len < (ulong)c->remwindow) {
        len = pVar7.len;
      }
      if (c->remmaxpkt <= len) {
        len = (ulong)c->remmaxpkt;
      }
      p_Var3 = ((psVar2->ppl).bpp)->vt->new_pktout;
      if (sVar4 == 0) {
        pPVar5 = (*p_Var3)(0x5e);
        bs = pPVar5->binarysink_;
        val = (unsigned_long)c->remoteid;
      }
      else {
        pPVar5 = (*p_Var3)(0x5f);
        bs = pPVar5->binarysink_;
        BinarySink_put_uint32(bs,(ulong)c->remoteid);
        val = 1;
      }
      BinarySink_put_uint32(bs,val);
      pl.len = len;
      pl.ptr = pVar7.ptr;
      BinarySink_put_stringpl(pPVar5->binarysink_,pl);
      pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar5->qnode);
      bufchain_consume(ch_00,len);
      puVar1 = &c->remwindow;
      *puVar1 = *puVar1 - (int)len;
    } while (*puVar1 != 0);
  }
  sVar4 = bufchain_size(&c->outbuffer);
  sVar6 = bufchain_size(&c->errbuffer);
  if ((sVar6 + sVar4 == 0) && (c->pending_eof == true)) {
    ssh2_channel_try_eof(c);
  }
  ssh_sendbuffer_changed((psVar2->ppl).ssh);
  return sVar6 + sVar4;
}

Assistant:

static size_t ssh2_try_send(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;
    size_t bufsize;

    if (!c->halfopen) {
        while (c->remwindow > 0 &&
               (bufchain_size(&c->outbuffer) > 0 ||
                bufchain_size(&c->errbuffer) > 0)) {
            bufchain *buf = (bufchain_size(&c->errbuffer) > 0 ?
                             &c->errbuffer : &c->outbuffer);

            ptrlen data = bufchain_prefix(buf);
            if (data.len > c->remwindow)
                data.len = c->remwindow;
            if (data.len > c->remmaxpkt)
                data.len = c->remmaxpkt;
            if (buf == &c->errbuffer) {
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH2_MSG_CHANNEL_EXTENDED_DATA);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, SSH2_EXTENDED_DATA_STDERR);
            } else {
                pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_DATA);
                put_uint32(pktout, c->remoteid);
            }
            put_stringpl(pktout, data);
            pq_push(s->ppl.out_pq, pktout);
            bufchain_consume(buf, data.len);
            c->remwindow -= data.len;
        }
    }

    /*
     * After having sent as much data as we can, return the amount
     * still buffered.
     */
    bufsize = bufchain_size(&c->outbuffer) + bufchain_size(&c->errbuffer);

    /*
     * And if there's no data pending but we need to send an EOF, send
     * it.
     */
    if (!bufsize && c->pending_eof)
        ssh2_channel_try_eof(c);

    ssh_sendbuffer_changed(s->ppl.ssh);
    return bufsize;
}